

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

statusline checkprotoprefix(Curl_easy *data,connectdata *conn,char *s,size_t len)

{
  statusline sVar1;
  size_t len_local;
  char *s_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  sVar1 = checkhttpprefix(data,s,len);
  return sVar1;
}

Assistant:

static statusline
checkprotoprefix(struct Curl_easy *data, struct connectdata *conn,
                 const char *s, size_t len)
{
#ifndef CURL_DISABLE_RTSP
  if(conn->handler->protocol & CURLPROTO_RTSP)
    return checkrtspprefix(data, s, len);
#else
  (void)conn;
#endif /* CURL_DISABLE_RTSP */

  return checkhttpprefix(data, s, len);
}